

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Callback.hpp
# Opt level: O0

void __thiscall
Callback::Emitter::emit<MyEmitter,String>
          (Emitter *this,offset_in_MyEmitter_to_subr signal,String *arg0)

{
  void *pvVar1;
  bool bVar2;
  Slot *pSVar3;
  String *in_RCX;
  long *plVar4;
  code *local_118;
  String local_c0;
  Iterator local_88;
  Iterator i;
  MemberFuncPtr local_70;
  undefined1 local_60 [8];
  SignalActivation activation;
  String *arg0_local;
  offset_in_MyEmitter_to_subr signal_local;
  Emitter *this_local;
  
  i.item = (Item *)signal;
  MemberFuncPtr::MemberFuncPtr<void(MyEmitter::*)(String)>(&local_70,signal);
  SignalActivation::SignalActivation((SignalActivation *)local_60,this,&local_70);
  local_88.item = (Item *)activation.data;
  while (bVar2 = List<Callback::Emitter::Slot>::Iterator::operator!=(&local_88,&activation.begin),
        bVar2) {
    pSVar3 = List<Callback::Emitter::Slot>::Iterator::operator->(&local_88);
    if (pSVar3->state == connected) {
      pSVar3 = List<Callback::Emitter::Slot>::Iterator::operator->(&local_88);
      pvVar1 = pSVar3->object;
      pSVar3 = List<Callback::Emitter::Slot>::Iterator::operator->(&local_88);
      local_118 = (code *)(pSVar3->slot).ptr;
      plVar4 = (long *)((long)pvVar1 + *(long *)&(pSVar3->slot).field_0x8);
      if (((ulong)local_118 & 1) != 0) {
        local_118 = *(code **)(local_118 + *plVar4 + -1);
      }
      String::String(&local_c0,in_RCX);
      (*local_118)(plVar4,&local_c0);
      String::~String(&local_c0);
    }
    if (((byte)activation.next & 1) != 0) break;
    List<Callback::Emitter::Slot>::Iterator::operator++(&local_88);
  }
  SignalActivation::~SignalActivation((SignalActivation *)local_60);
  return;
}

Assistant:

void emit(void (X::*signal)(A), A arg0) {SignalActivation activation(this, signal); for(List<Slot>::Iterator i = activation.begin; i != activation.end; ++i) {if(i->state == Slot::connected)
      (((X*)i->object)->*((MemberFuncPtr1<X, A>*)&i->slot)->ptr)(arg0); if(activation.invalidated) return;}}